

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgap_dictionary.h
# Opt level: O0

void __thiscall
bwtil::cgap_dictionary::cgap_dictionary
          (cgap_dictionary *this,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *gaps)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  reference pvVar5;
  reference ppVar6;
  reference pvVar7;
  reference pvVar8;
  ulint uVar9;
  long lVar10;
  ulong uVar11;
  iterator iVar12;
  iterator iVar13;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_RSI;
  long in_RDI;
  undefined1 auVar14 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_ZMM1 [64];
  reference rVar15;
  iterator iVar16;
  reference rVar17;
  reference rVar18;
  anon_class_1_0_00000001 comp;
  uint j_1;
  ulint h_1;
  ulint j;
  reference b;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  ulint h;
  size_type l;
  ulint i_6;
  ulint i_5;
  ulint H_size;
  ulint i_4;
  ulint p_1;
  ulint max_allowed_bitsize;
  ulint p;
  ulint opt_bitsize;
  ulint i_3;
  ulint i_2;
  ulint i_1;
  vector<double,_std::allocator<double>_> code_freq;
  ulint i;
  vector<bool,_std::allocator<bool>_> c_1;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *__range2_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> long_codes;
  vector<bool,_std::allocator<bool>_> c;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *__range2_2;
  HuffmanTree<unsigned_long> ht;
  pair<unsigned_long,_unsigned_long> g_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  codes;
  pair<unsigned_long,_unsigned_long> g;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range2;
  ulint max_gap;
  ulint n;
  ulint u;
  HuffmanTree<unsigned_long> *in_stack_fffffffffffffaa8;
  HuffmanTree<unsigned_long> *in_stack_fffffffffffffab0;
  allocator_type *in_stack_fffffffffffffab8;
  unsigned_long *__elements;
  cgap_dictionary *in_stack_fffffffffffffac0;
  reference in_stack_fffffffffffffac8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffad0;
  size_t in_stack_fffffffffffffad8;
  packed_view<std::vector> *in_stack_fffffffffffffae0;
  key_type *in_stack_fffffffffffffae8;
  map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  *in_stack_fffffffffffffaf0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffaf8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb00;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffb68;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffb70;
  reference local_390;
  uint local_37c;
  unsigned_long *local_378;
  reference local_370;
  reference local_360;
  ulong local_350;
  reference local_348;
  _Bit_type *local_338;
  uint local_330;
  _Bit_type *local_328;
  uint local_320;
  _Bit_type *local_318;
  uint local_310;
  _Bit_type *local_308;
  uint local_300;
  vector<bool,_std::allocator<bool>_> *local_2f8;
  long local_2f0;
  size_type local_2e8;
  ulong local_2e0;
  reference local_2d8;
  ulong local_2c8;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulint local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  undefined8 local_210;
  vector<double,_std::allocator<double>_> local_208;
  ulong local_1f0;
  vector<bool,_std::allocator<bool>_> *local_1c0;
  __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_198;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  HuffmanTree<unsigned_long> *in_stack_fffffffffffffe90;
  __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
  local_150;
  undefined1 *local_148;
  pair<unsigned_long,_unsigned_long> local_d8;
  pair<unsigned_long,_unsigned_long> *local_c8;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_c0 [5];
  undefined1 local_98 [152];
  
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)in_stack_fffffffffffffab0);
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)in_stack_fffffffffffffab0);
  std::
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
            *)0x127476);
  std::
  map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
         *)0x12748f);
  *(undefined1 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  sVar4 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size(in_RSI);
  if (sVar4 == 1) {
    pvVar5 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[](in_RSI,0);
    local_98._112_8_ = pvVar5->first + 1;
    local_98._108_4_ = 1;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
              ((pair<unsigned_long,_unsigned_long> *)(local_98 + 0x78),
               (unsigned_long *)(local_98 + 0x70),(int *)(local_98 + 0x6c));
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffab0,(value_type *)in_stack_fffffffffffffaa8);
  }
  local_98._80_8_ = 0;
  local_98._72_8_ = 0;
  local_98._64_8_ = (pointer)0x0;
  local_98._48_8_ =
       std::
       vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)in_stack_fffffffffffffaa8);
  local_98._40_8_ =
       std::
       vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)in_stack_fffffffffffffaa8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                             *)in_stack_fffffffffffffab0,
                            (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                             *)in_stack_fffffffffffffaa8), bVar2) {
    ppVar6 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator*((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                          *)(local_98 + 0x30));
    local_98._24_8_ = ppVar6->first;
    local_98._32_8_ = ppVar6->second;
    local_98._80_8_ = local_98._24_8_ * local_98._32_8_ + local_98._80_8_;
    local_98._72_8_ = local_98._32_8_ + local_98._72_8_;
    if ((ulong)local_98._64_8_ < (ulong)local_98._24_8_) {
      local_98._64_8_ = local_98._24_8_;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                  *)(local_98 + 0x30));
  }
  bVar3 = intlog2(local_98._64_8_);
  *(ulong *)(in_RDI + 0xb0) = (ulong)bVar3;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)0x127674);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x127681);
  local_c0[0]._M_current =
       (pair<unsigned_long,_unsigned_long> *)
       std::
       vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)in_stack_fffffffffffffaa8);
  local_c8 = (pair<unsigned_long,_unsigned_long> *)
             std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffaa8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                             *)in_stack_fffffffffffffab0,
                            (__normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                             *)in_stack_fffffffffffffaa8), bVar2) {
    ppVar6 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::operator*(local_c0);
    local_d8 = *ppVar6;
    in_ZMM0 = ZEXT1664((undefined1  [16])local_d8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffac0,
               (value_type *)in_stack_fffffffffffffab8);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::operator++(local_c0);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  HuffmanTree<unsigned_long>::HuffmanTree(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffac0);
  HuffmanTree<unsigned_long>::getCodes(in_stack_fffffffffffffaa8);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::operator=((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *)in_stack_fffffffffffffac0,
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *)in_stack_fffffffffffffab8);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)in_stack_fffffffffffffac0);
  local_148 = local_98;
  local_150._M_current =
       (vector<bool,_std::allocator<bool>_> *)
       std::
       vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ::begin((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                *)in_stack_fffffffffffffaa8);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::end((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         *)in_stack_fffffffffffffaa8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
                             *)in_stack_fffffffffffffab0,
                            (__normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
                             *)in_stack_fffffffffffffaa8), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
    ::operator*(&local_150);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x127829);
    __gnu_cxx::
    __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
    ::operator++(&local_150);
  }
  HuffmanTree<unsigned_long>::~HuffmanTree(in_stack_fffffffffffffab0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffac0);
  local_1a0 = 0;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1278bf);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffad0,
             (size_type)in_stack_fffffffffffffac8,(value_type *)in_stack_fffffffffffffac0,
             in_stack_fffffffffffffab8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1278f0);
  local_1b0 = local_98;
  local_1b8._M_current =
       (vector<bool,_std::allocator<bool>_> *)
       std::
       vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ::begin((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                *)in_stack_fffffffffffffaa8);
  local_1c0 = (vector<bool,_std::allocator<bool>_> *)
              std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::end((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     *)in_stack_fffffffffffffaa8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
                             *)in_stack_fffffffffffffab0,
                            (__normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
                             *)in_stack_fffffffffffffaa8), bVar2) {
    __gnu_cxx::
    __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
    ::operator*(&local_1b8);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    for (local_1f0 = 0; uVar11 = local_1f0,
        sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffaf0),
        uVar11 < sVar4; local_1f0 = local_1f0 + 1) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_198,local_1f0);
      *pvVar7 = *pvVar7 + 1;
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x127a37);
    __gnu_cxx::
    __normal_iterator<std::vector<bool,_std::allocator<bool>_>_*,_std::vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>_>
    ::operator++(&local_1b8);
  }
  local_210 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x127a6a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffad0,
             (size_type)in_stack_fffffffffffffac8,(value_type_conflict1 *)in_stack_fffffffffffffac0,
             (allocator_type *)in_stack_fffffffffffffab8);
  std::allocator<double>::~allocator((allocator<double> *)0x127a9b);
  local_220 = 0;
  while( true ) {
    uVar11 = local_220;
    auVar14 = in_ZMM0._0_16_;
    sVar4 = std::
            vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ::size((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    *)local_98);
    if (sVar4 <= uVar11) break;
    pvVar5 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[](in_RSI,local_220);
    auVar14 = vcvtusi2sd_avx512f(auVar14,pvVar5->second);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  *)local_98,local_220);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffaf0);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_208,sVar4);
    dVar1 = auVar14._0_8_ + *pvVar8;
    in_ZMM0 = ZEXT864((ulong)dVar1);
    *pvVar8 = dVar1;
    local_220 = local_220 + 1;
  }
  for (local_228 = 1; uVar11 = local_228,
      sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_208), uVar11 < sVar4;
      local_228 = local_228 + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_208,local_228 - 1);
    dVar1 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_208,local_228);
    *pvVar8 = dVar1 + *pvVar8;
  }
  local_230 = 0;
  while( true ) {
    uVar11 = local_230;
    auVar14 = in_ZMM1._0_16_;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(&local_208);
    if (sVar4 <= uVar11) break;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_208,local_230);
    dVar1 = *pvVar8;
    auVar14 = vcvtusi2sd_avx512f(auVar14,local_98._72_8_);
    in_ZMM1 = ZEXT1664(auVar14);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_208,local_230);
    *pvVar8 = (dVar1 * 100.0) / auVar14._0_8_;
    local_230 = local_230 + 1;
  }
  *(undefined1 *)(in_RDI + 0xa8) = 1;
  local_238 = 0x8000000000000000;
  for (local_240 = 1; local_240 < 0x1e; local_240 = local_240 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_198,local_240);
    uVar9 = assess_bitsize(in_stack_fffffffffffffac0,(ulint)in_stack_fffffffffffffab8,
                           (ulint)in_stack_fffffffffffffab0);
    if (uVar9 < local_238) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_198,local_240);
      local_238 = assess_bitsize(in_stack_fffffffffffffac0,(ulint)in_stack_fffffffffffffab8,
                                 (ulint)in_stack_fffffffffffffab0);
      *(char *)(in_RDI + 0xa8) = (char)local_240;
    }
  }
  local_248 = local_238 + (local_238 * 0x14) / 100;
  for (local_250 = 1; local_250 < 0x1e; local_250 = local_250 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_198,local_250);
    uVar9 = assess_bitsize(in_stack_fffffffffffffac0,(ulint)in_stack_fffffffffffffab8,
                           (ulint)in_stack_fffffffffffffab0);
    if (uVar9 <= local_248) {
      *(char *)(in_RDI + 0xa8) = (char)local_250;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffac0);
  for (local_258 = 0; uVar11 = local_258,
      sVar4 = std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::size((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *)local_98), uVar11 < sVar4; local_258 = local_258 + 1) {
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  *)local_98,local_258);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator[](in_RSI,local_258);
    std::
    map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
    ::operator[](in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
               in_stack_fffffffffffffb40);
  }
  local_260 = 1L << ((ulong)*(byte *)(in_RDI + 0xa8) & 0x3f);
  bv::internal::packed_view<std::vector>::packed_view
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
  bv::internal::packed_view<std::vector>::operator=
            ((packed_view<std::vector> *)in_stack_fffffffffffffab0,
             (packed_view<std::vector> *)in_stack_fffffffffffffaa8);
  bv::internal::packed_view<std::vector>::~packed_view((packed_view<std::vector> *)0x128055);
  intlog2((ulong)*(byte *)(in_RDI + 0xa8));
  bv::internal::packed_view<std::vector>::packed_view
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
  bv::internal::packed_view<std::vector>::operator=
            ((packed_view<std::vector> *)in_stack_fffffffffffffab0,
             (packed_view<std::vector> *)in_stack_fffffffffffffaa8);
  bv::internal::packed_view<std::vector>::~packed_view((packed_view<std::vector> *)0x1280ad);
  local_2c8 = 0;
  while( true ) {
    rVar18._M_mask = (_Bit_type)in_stack_fffffffffffffae8;
    rVar18._M_p = (_Bit_type *)in_stack_fffffffffffffaf0;
    if (local_260 <= local_2c8) break;
    rVar15 = bv::internal::packed_view<std::vector>::operator[]
                       ((packed_view<std::vector> *)in_stack_fffffffffffffab0,
                        (size_t)in_stack_fffffffffffffaa8);
    local_2d8 = rVar15;
    bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
              ((item_reference<bv::internal::packed_view<std::vector>_> *)in_stack_fffffffffffffab0,
               (value_type)in_stack_fffffffffffffaa8);
    local_2c8 = local_2c8 + 1;
  }
  local_2e0 = 0;
  while( true ) {
    uVar11 = local_2e0;
    sVar4 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size(in_RSI);
    if (sVar4 <= uVar11) break;
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  *)local_98,local_2e0);
    local_2e8 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)rVar18._M_p);
    if (*(byte *)(in_RDI + 0xa8) < local_2e8) {
      local_378 = (unsigned_long *)0x0;
      local_37c = 0;
      while( true ) {
        uVar11 = (ulong)local_37c;
        std::
        vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *)local_98,local_2e0);
        sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)rVar18._M_p);
        if (sVar4 <= uVar11) break;
        lVar10 = (long)local_378 * 2;
        std::
        vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
        ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *)local_98,local_2e0);
        rVar18 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffad0,(size_type)in_stack_fffffffffffffac8);
        local_390 = rVar18;
        bVar2 = ::std::_Bit_reference::operator_cast_to_bool(&local_390);
        local_378 = (unsigned_long *)(lVar10 + (ulong)bVar2);
        local_37c = local_37c + 1;
      }
      in_stack_fffffffffffffac0 = (cgap_dictionary *)local_98;
      __elements = local_378;
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    *)in_stack_fffffffffffffac0,local_2e0);
      sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)rVar18._M_p);
      local_378 = (unsigned_long *)((long)__elements << ((ulong)(byte)-(char)sVar4 & 0x3f));
      in_stack_fffffffffffffad0 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 0x60);
      in_stack_fffffffffffffac8 =
           std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::operator[](in_RSI,local_2e0);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    *)in_stack_fffffffffffffac0,local_2e0);
      std::vector<bool,_std::allocator<bool>_>::size
                ((vector<bool,_std::allocator<bool>_> *)rVar18._M_p);
      std::tuple<unsigned_long,_unsigned_long,_unsigned_char>::
      tuple<unsigned_long_&,_unsigned_long_&,_unsigned_char,_true,_true>
                ((tuple<unsigned_long,_unsigned_long,_unsigned_char> *)in_stack_fffffffffffffac0,
                 __elements,&in_stack_fffffffffffffab0->sigma_0,(uchar *)in_stack_fffffffffffffaa8);
      std::
      vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
      ::push_back((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
                   *)in_stack_fffffffffffffab0,(value_type *)in_stack_fffffffffffffaa8);
    }
    else {
      local_2f0 = 0;
      local_2f8 = std::
                  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                *)local_98,local_2e0);
      iVar16 = std::vector<bool,_std::allocator<bool>_>::begin
                         ((vector<bool,_std::allocator<bool>_> *)0x1281fc);
      local_318 = iVar16.super__Bit_iterator_base._M_p;
      local_310 = iVar16.super__Bit_iterator_base._M_offset;
      local_308 = local_318;
      local_300 = local_310;
      iVar16 = std::vector<bool,_std::allocator<bool>_>::end(local_2f8);
      local_338 = iVar16.super__Bit_iterator_base._M_p;
      local_330 = iVar16.super__Bit_iterator_base._M_offset;
      local_328 = local_338;
      local_320 = local_330;
      while( true ) {
        bVar2 = std::operator!=((_Bit_iterator_base *)in_stack_fffffffffffffab0,
                                (_Bit_iterator_base *)in_stack_fffffffffffffaa8);
        if (!bVar2) break;
        rVar17 = std::_Bit_iterator::operator*((_Bit_iterator *)0x12829e);
        lVar10 = local_2f0 * 2;
        local_348 = rVar17;
        bVar2 = ::std::_Bit_reference::operator_cast_to_bool(&local_348);
        local_2f0 = lVar10 + (ulong)bVar2;
        std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_fffffffffffffab0);
      }
      local_2f0 = local_2f0 << (*(char *)(in_RDI + 0xa8) - (char)local_2e8 & 0x3fU);
      for (local_350 = 0;
          local_350 < (ulong)(1L << (*(char *)(in_RDI + 0xa8) - (char)local_2e8 & 0x3fU));
          local_350 = local_350 + 1) {
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::operator[](in_RSI,local_2e0);
        rVar15 = bv::internal::packed_view<std::vector>::operator[]
                           ((packed_view<std::vector> *)in_stack_fffffffffffffab0,
                            (size_t)in_stack_fffffffffffffaa8);
        local_360 = rVar15;
        bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                  ((item_reference<bv::internal::packed_view<std::vector>_> *)
                   in_stack_fffffffffffffab0,(value_type)in_stack_fffffffffffffaa8);
        rVar15 = bv::internal::packed_view<std::vector>::operator[]
                           ((packed_view<std::vector> *)in_stack_fffffffffffffab0,
                            (size_t)in_stack_fffffffffffffaa8);
        local_370 = rVar15;
        bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=
                  ((item_reference<bv::internal::packed_view<std::vector>_> *)
                   in_stack_fffffffffffffab0,(value_type)in_stack_fffffffffffffaa8);
      }
    }
    local_2e0 = local_2e0 + 1;
  }
  iVar12 = std::
           vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
           ::begin((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
                    *)in_stack_fffffffffffffaa8);
  iVar13 = std::
           vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
           ::end((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
                  *)in_stack_fffffffffffffaa8);
  ::std::
  sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,unsigned_char>*,std::vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>>,bwtil::cgap_dictionary::cgap_dictionary(std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>)::_lambda(std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::tuple<unsigned_long,unsigned_long,unsigned_char>)_1_>
            (iVar12._M_current,iVar13._M_current);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)in_stack_fffffffffffffac0);
  return;
}

Assistant:

cgap_dictionary(vector<pair<ulint,ulint> > gaps){

		assert(gaps.size()>0);

		//if there is only 1 distinct gap, this creates problems with the huffman codes ...
		//in this case, create one fake gap. There will be 2 codes: 0 and 1
		if(gaps.size()==1)
			gaps.push_back({gaps[0].first+1,1});

		//compute u and n
		ulint u=0;
		ulint n=0;

		ulint max_gap=0;

		for(auto g : gaps){

			assert(g.first>0);
			assert(g.second>0);

			u += (g.first*g.second);
			n += g.second;

			if(g.first>max_gap)
				max_gap=g.first;

		}

		log2_max_gap = intlog2(max_gap);

		//build Huffman tree and retrieve boolean codes
		vector<vector<bool> > codes;

		{
			vector<ulint> freqs;

			for(auto g : gaps)
				freqs.push_back(g.second);

			HuffmanTree<ulint> ht(freqs);

			codes = ht.getCodes();

			for(auto c : codes){

				//make sure that no code is longer than 63 bits
				assert(c.size()<sizeof(ulint)*8);

			}

		}

		assert(codes.size()==gaps.size());

		{
			//count long codes
			vector<ulint> long_codes(64,0);
			for(auto c : codes)
				for(ulint i=0;i<c.size();++i)
					long_codes[i]++;

			//just for testing purposes: code_freq[i] contains the cumulative
			//frequency of codes having length <= i
			vector<double> code_freq(64,0);
			for(ulint i=0;i<codes.size();++i)
				code_freq[codes[i].size()]+=gaps[i].second;
			for(ulint i=1;i<code_freq.size();++i)
				code_freq[i] += code_freq[i-1];
			for(ulint i=0;i<code_freq.size();++i)
				code_freq[i] = 100*code_freq[i]/n;

			//compute optimal prefix length for the hash table,
			//i.e. prefix length that minimizes overall size of the dictionary

			prefix_length=1;
			ulint opt_bitsize = ulint(1)<<63;

			//for efficiency reasons, we limit the maximum prefix length to 30 (in order to avoid
			//huge dictionaries)
			for(ulint p=1;p<30;++p){

				//cout << p << " " << code_freq[p] << " " << long_codes[p] << " " << assess_bitsize(p,long_codes[p]) << endl;

				if(assess_bitsize(p,long_codes[p])<opt_bitsize){

					opt_bitsize = assess_bitsize(p,long_codes[p]);
					prefix_length = p;

				}

			}

			//now choose largest prefix that exceeds at most 20% the optimal bitsize
			ulint max_allowed_bitsize = opt_bitsize + (20*opt_bitsize)/100;

			//cout << "opt p = " << (uint)prefix_length << endl;
			//cout << "opt bitsize = " << opt_bitsize << endl;
			//cout << "max bitsize = " << max_allowed_bitsize << endl;

			for(ulint p=1;p<30;++p){

				if(assess_bitsize(p,long_codes[p])<=max_allowed_bitsize)
					prefix_length = p;

			}

			//cout << "optimal prefix_length = " << (ulint)prefix_length<<endl;
			//cout << "with the hash table we catch " << code_freq[prefix_length] << "% of the codes!"<<endl;

		}

		//build the code function
		for(ulint i=0;i<codes.size();++i)
			encoding[gaps[i].first] = codes[i];

		ulint H_size = ulint(1)<<prefix_length;

		H_val = packed_view<vector>(log2_max_gap,H_size);
		H_len = packed_view<vector>(intlog2(prefix_length),H_size);

		for(ulint i=0;i<H_size;++i) H_len[i] = 0;

		//build hash

		//store here triples of the form <code,gap value,code length>
		//where code is the left-shifted Huffman code

		for(ulint i=0;i<gaps.size();++i){

			//code length
			auto l = codes[i].size();
			assert(l>0);

			if(l<=prefix_length){

				//the hash is sufficient to decode this code. Compute H entry
				ulint h = 0;

				for(auto b : codes[i])
					h = h*2+b;

				//shift to left so to occupy exactly prefix_length bits
				h = h << (prefix_length-l);

				//fill all combinations of h followed by any bit sequence (in total prefix_length bits)
				for(ulint j=0;j<(ulint(1)<<(prefix_length-l));++j){
					H_val[h+j] = gaps[i].first;
					H_len[h+j] = l;
				}

			}else{

				//pack the code in a memory word
				ulint h = 0;

				for(uint j=0;j<codes[i].size();++j)
					h = h*2 + codes[i][j];

				//left-shift
				h = h << (sizeof(ulint)*8-codes[i].size());

				H_long.push_back(triple(h,gaps[i].first,(uint8_t)codes[i].size()));

			}

		}

		auto comp = [](triple x, triple y){ return std::get<0>(x) < std::get<0>(y); };
		std::sort(H_long.begin(),H_long.end(),comp);

		assert(log2_max_gap>0);

	}